

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O3

void __thiscall
HACD::RMNode::Create(RMNode *this,size_t depth,size_t maxDepth,size_t minLeafSize,Float minAxisSize)

{
  Vec3<long> *pVVar1;
  Vec3<double> *pVVar2;
  Vec3<double> *pVVar3;
  Vec3<double> *pVVar4;
  BBox *pBVar5;
  BBox *pBVar6;
  BBox *pBVar7;
  double dVar8;
  double dVar9;
  RaycastMesh *pRVar10;
  size_t sVar11;
  RMNode *pRVar12;
  Vec3<long> *pVVar13;
  long lVar14;
  long *plVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  int k;
  Vec3<double> *pVVar20;
  SArray<long,_16UL> *pSVar21;
  long lVar22;
  BBox *pBVar23;
  ulong uVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  long f;
  long local_50;
  long local_48 [3];
  
  ComputeBB(this);
  if ((depth != maxDepth) && (uVar24 = (this->m_triIDs).m_size, minLeafSize < uVar24)) {
    dVar25 = (this->m_bBox).m_min.m_data[0];
    dVar19 = (this->m_bBox).m_max.m_data[0] - dVar25;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = (long)dVar19;
    auVar18 = vsubpd_avx(*(undefined1 (*) [16])((this->m_bBox).m_max.m_data + 1),
                         *(undefined1 (*) [16])((this->m_bBox).m_min.m_data + 1));
    auVar17 = vshufpd_avx(auVar18,auVar18,1);
    auVar29 = vmaxsd_avx(auVar17,auVar18);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar19;
    auVar29 = vmaxsd_avx(auVar29,auVar27);
    dVar28 = auVar29._0_8_;
    if (minAxisSize <= dVar28) {
      pRVar10 = this->m_rm;
      sVar11 = pRVar10->m_nNodes;
      this->m_idLeft = sVar11;
      pRVar10->m_nNodes = sVar11 + 2;
      this->m_idRight = sVar11 + 1;
      pRVar12 = pRVar10->m_nodes;
      pVVar2 = &pRVar12[sVar11].m_bBox.m_max;
      pVVar3 = (Vec3<double> *)(pRVar12[sVar11].m_bBox.m_max.m_data + 1);
      pVVar4 = (Vec3<double> *)(pRVar12[sVar11].m_bBox.m_max.m_data + 2);
      pBVar5 = &pRVar12[sVar11 + 1].m_bBox;
      pBVar6 = (BBox *)(pRVar12[sVar11 + 1].m_bBox.m_min.m_data + 1);
      pBVar7 = (BBox *)(pRVar12[sVar11 + 1].m_bBox.m_min.m_data + 2);
      pRVar12 = pRVar12 + sVar11;
      *(size_t *)(pVVar2 + -2) = sVar11;
      *(size_t *)(pVVar2 + 8) = sVar11 + 1;
      (((BBox *)(pVVar2 + -1))->m_min).m_data[0] = dVar25;
      (((BBox *)(pVVar2 + -1))->m_min).m_data[1] = (this->m_bBox).m_min.m_data[1];
      (((BBox *)(pVVar2 + -1))->m_min).m_data[2] = (this->m_bBox).m_min.m_data[2];
      dVar25 = (this->m_bBox).m_max.m_data[0];
      pVVar2->m_data[0] = dVar25;
      dVar8 = (this->m_bBox).m_max.m_data[1];
      pVVar3->m_data[0] = dVar8;
      dVar9 = (this->m_bBox).m_max.m_data[2];
      pVVar4->m_data[0] = dVar9;
      (pBVar5->m_min).m_data[0] = (this->m_bBox).m_min.m_data[0];
      (pBVar6->m_min).m_data[0] = (this->m_bBox).m_min.m_data[1];
      (pBVar7->m_min).m_data[0] = (this->m_bBox).m_min.m_data[2];
      (pBVar7->m_min).m_data[1] = (this->m_bBox).m_max.m_data[0];
      (pBVar7->m_min).m_data[2] = (this->m_bBox).m_max.m_data[1];
      (pBVar7->m_max).m_data[0] = (this->m_bBox).m_max.m_data[2];
      *(RaycastMesh **)((long)(pBVar7 + -2) + 0x28) = pRVar10;
      *(RaycastMesh **)((long)(pBVar7 + 3) + 0x28) = pRVar10;
      if ((dVar19 != dVar28) || (pVVar20 = pVVar2, pBVar23 = pBVar5, NAN(dVar19) || NAN(dVar28))) {
        dVar25 = auVar18._0_8_;
        bVar16 = dVar25 == dVar28;
        pBVar23 = pBVar6;
        pVVar20 = pVVar3;
        if (!bVar16) {
          pBVar23 = pBVar7;
          pVVar20 = pVVar4;
        }
        if (NAN(dVar25) || NAN(dVar28)) {
          pBVar23 = pBVar7;
          pVVar20 = pVVar4;
        }
        auVar26._0_8_ = (ulong)bVar16 * (long)dVar25 + (ulong)!bVar16 * auVar17._0_8_;
        auVar26._8_8_ = auVar17._8_8_;
        dVar25 = (double)((ulong)bVar16 * (long)dVar8 + (ulong)!bVar16 * (long)dVar9);
      }
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar25;
      auVar29 = vfmadd132sd_fma(auVar26,auVar29,ZEXT816(0xbfe0000000000000));
      pVVar20->m_data[0] = auVar29._0_8_;
      (pBVar23->m_min).m_data[0] = auVar29._0_8_;
      pVVar13 = this->m_rm->m_triangles;
      pVVar20 = this->m_rm->m_vertices;
      SArray<long,_16UL>::Resize(&pRVar12->m_triIDs,uVar24);
      SArray<long,_16UL>::Resize(&pRVar12[1].m_triIDs,(this->m_triIDs).m_size);
      if ((this->m_triIDs).m_size == 0) {
LAB_0083a455:
        Create(pRVar12 + 1,depth + 1,maxDepth,minLeafSize,minAxisSize);
        Create(pRVar12,depth + 1,maxDepth,minLeafSize,minAxisSize);
        (this->m_triIDs).m_size = 0;
        plVar15 = (this->m_triIDs).m_data;
        if (plVar15 != (long *)0x0) {
          operator_delete__(plVar15);
        }
        (this->m_triIDs).m_data = (long *)0x0;
        (this->m_triIDs).m_maxSize = 0x10;
        return;
      }
      uVar24 = 0;
LAB_0083a314:
      pSVar21 = &this->m_triIDs;
      if ((this->m_triIDs).m_maxSize != 0x10) {
        pSVar21 = (SArray<long,_16UL> *)(this->m_triIDs).m_data;
      }
      local_50 = pSVar21->m_data0[uVar24];
      pVVar1 = pVVar13 + local_50;
      local_48[0] = pVVar1->m_data[0];
      local_48[1] = pVVar1->m_data[1];
      local_48[2] = pVVar13[local_50].m_data[2];
      lVar22 = 0;
      do {
        lVar14 = local_48[lVar22];
        if ((((pVVar20[lVar14].m_data[0] <= pVVar2->m_data[0]) &&
             ((pRVar12->m_bBox).m_min.m_data[0] <= pVVar20[lVar14].m_data[0])) &&
            (pVVar20[lVar14].m_data[1] <= pVVar3->m_data[0])) &&
           ((((pRVar12->m_bBox).m_min.m_data[1] <= pVVar20[lVar14].m_data[1] &&
             (pVVar20[lVar14].m_data[2] <= pVVar4->m_data[0])) &&
            (pSVar21 = &pRVar12->m_triIDs,
            (pRVar12->m_bBox).m_min.m_data[2] <= pVVar20[lVar14].m_data[2])))) goto LAB_0083a427;
        lVar22 = lVar22 + 1;
      } while (lVar22 != 3);
      lVar22 = 0;
      do {
        lVar14 = local_48[lVar22];
        if (((pVVar20[lVar14].m_data[0] <= pRVar12[1].m_bBox.m_max.m_data[0]) &&
            ((pBVar5->m_min).m_data[0] <= pVVar20[lVar14].m_data[0])) &&
           ((pVVar20[lVar14].m_data[1] <= pRVar12[1].m_bBox.m_max.m_data[1] &&
            ((((pBVar6->m_min).m_data[0] <= pVVar20[lVar14].m_data[1] &&
              (pVVar20[lVar14].m_data[2] <= pRVar12[1].m_bBox.m_max.m_data[2])) &&
             (pSVar21 = &pRVar12[1].m_triIDs, (pBVar7->m_min).m_data[0] <= pVVar20[lVar14].m_data[2]
             )))))) goto LAB_0083a427;
        lVar22 = lVar22 + 1;
      } while (lVar22 != 3);
      goto LAB_0083a409;
    }
  }
  this->m_leaf = true;
  return;
LAB_0083a427:
  SArray<long,_16UL>::PushBack(pSVar21,&local_50);
LAB_0083a409:
  uVar24 = uVar24 + 1;
  if ((this->m_triIDs).m_size <= uVar24) goto LAB_0083a455;
  goto LAB_0083a314;
}

Assistant:

void RMNode::Create(size_t depth, size_t maxDepth, size_t minLeafSize, Float minAxisSize)
	{
		ComputeBB();
		Vec3<Float> d = m_bBox.m_max - m_bBox.m_min;
		Float maxDiff = std::max<Float>(d.X(), std::max<Float>(d.Y(), d.Z()));
		RMSplitAxis split;
		if		(d.X() == maxDiff) split = RMSplitAxis_X;
		else if (d.Y() == maxDiff) split = RMSplitAxis_Y;
		else					   split = RMSplitAxis_Z;
	
		if (depth == maxDepth || minLeafSize >= m_triIDs.Size() || maxDiff < minAxisSize)
		{
			m_leaf = true;
			return;
		}
		m_idLeft  = (long)m_rm->AddNode();
		m_idRight = (long)m_rm->AddNode();
		RMNode & leftNode  = m_rm->m_nodes[m_idLeft];	
		RMNode & rightNode = m_rm->m_nodes[m_idRight];
		leftNode.m_id      = m_idLeft;
		rightNode.m_id     = m_idRight;
		leftNode.m_bBox    = m_bBox;
		rightNode.m_bBox   = m_bBox;
		leftNode.m_rm	   = m_rm;
		rightNode.m_rm	   = m_rm;

		if ( split == RMSplitAxis_X)
		{
			leftNode.m_bBox.m_max.X() = leftNode.m_bBox.m_max.X() - d.X() * 0.5;
			rightNode.m_bBox.m_min.X() = leftNode.m_bBox.m_max.X();
		}
		else if ( split == RMSplitAxis_Y)
		{
			leftNode.m_bBox.m_max.Y() = leftNode.m_bBox.m_max.Y() - d.Y() * 0.5;
			rightNode.m_bBox.m_min.Y() = leftNode.m_bBox.m_max.Y();
		}
		else
		{
			leftNode.m_bBox.m_max.Z() = leftNode.m_bBox.m_max.Z() - d.Z() * 0.5;
			rightNode.m_bBox.m_min.Z() = leftNode.m_bBox.m_max.Z();
		}
		long f;
		long pts[3];
		long v;
		Vec3<long> * const triangles = m_rm->m_triangles;			
		Vec3<Float> * const vertices = m_rm->m_vertices;
		leftNode.m_triIDs.Resize(m_triIDs.Size());
		rightNode.m_triIDs.Resize(m_triIDs.Size());
		bool found;
		for(size_t id = 0; id < m_triIDs.Size(); ++id)
		{
			f = m_triIDs[id];
			pts[0] = triangles[f].X();
            pts[1] = triangles[f].Y();
            pts[2] = triangles[f].Z();

			found = false;
			for (int k = 0; k < 3; ++k)
			{
				v = pts[k];
				if ( vertices[v].X() <= leftNode.m_bBox.m_max.X() && 
					 vertices[v].X() >= leftNode.m_bBox.m_min.X() &&
					 vertices[v].Y() <= leftNode.m_bBox.m_max.Y() && 
					 vertices[v].Y() >= leftNode.m_bBox.m_min.Y() &&
					 vertices[v].Z() <= leftNode.m_bBox.m_max.Z() && 
					 vertices[v].Z() >= leftNode.m_bBox.m_min.Z() )
				{
					leftNode.m_triIDs.PushBack(f);
					found = true;
					break;
				}
			}
			if (!found)
			{
				for (int k = 0; k < 3; ++k)
				{
					v = pts[k];
					if ( vertices[v].X() <= rightNode.m_bBox.m_max.X() && 
						 vertices[v].X() >= rightNode.m_bBox.m_min.X() &&
						 vertices[v].Y() <= rightNode.m_bBox.m_max.Y() && 
						 vertices[v].Y() >= rightNode.m_bBox.m_min.Y() &&
						 vertices[v].Z() <= rightNode.m_bBox.m_max.Z() && 
						 vertices[v].Z() >= rightNode.m_bBox.m_min.Z() )
					{
						rightNode.m_triIDs.PushBack(f);
						break;
					}
				}		
			}
		}
		rightNode.Create(depth+1, maxDepth, minLeafSize, minAxisSize);
		leftNode.Create(depth+1, maxDepth, minLeafSize, minAxisSize);
		m_triIDs.Clear();
	}